

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O3

void assert_watch_file_current_dir(uv_loop_t *loop,int file_or_dir)

{
  int iVar1;
  char *name;
  char *pcVar2;
  uv_fs_event_t fs_event;
  uv_timer_t timer;
  undefined1 auStack_138 [136];
  undefined1 local_b0 [152];
  
  pcVar2 = "watch_file";
  name = "watch_file";
  remove("watch_file");
  create_file(name);
  iVar1 = uv_fs_event_init(loop,auStack_138);
  if (iVar1 == 0) {
    if (file_or_dir == 1) {
      pcVar2 = ".";
    }
    iVar1 = uv_fs_event_start(auStack_138,fs_event_cb_file_current_dir,pcVar2,0);
    if (iVar1 != 0) goto LAB_0014fe6b;
    iVar1 = uv_timer_init(loop,local_b0);
    if (iVar1 != 0) goto LAB_0014fe70;
    iVar1 = uv_timer_start(local_b0,timer_cb_touch,100,0);
    if (iVar1 != 0) goto LAB_0014fe75;
    if (timer_cb_touch_called != 0) goto LAB_0014fe7a;
    if (fs_event_cb_called == '\x01') goto LAB_0014fe7f;
    uv_run(loop,0);
    if (timer_cb_touch_called == 1) {
      if (fs_event_cb_called != '\0') {
        remove("watch_file");
        fs_event_cb_called = 0;
        timer_cb_touch_called = 0;
        uv_run(loop,0);
        return;
      }
      goto LAB_0014fe89;
    }
  }
  else {
    assert_watch_file_current_dir_cold_1();
LAB_0014fe6b:
    assert_watch_file_current_dir_cold_2();
LAB_0014fe70:
    assert_watch_file_current_dir_cold_3();
LAB_0014fe75:
    assert_watch_file_current_dir_cold_4();
LAB_0014fe7a:
    assert_watch_file_current_dir_cold_5();
LAB_0014fe7f:
    assert_watch_file_current_dir_cold_8();
  }
  assert_watch_file_current_dir_cold_6();
LAB_0014fe89:
  assert_watch_file_current_dir_cold_7();
  work_cb_count = work_cb_count + 1;
  return;
}

Assistant:

static void assert_watch_file_current_dir(uv_loop_t* const loop, int file_or_dir) {
  uv_timer_t timer;
  uv_fs_event_t fs_event;
  int r;

  /* Setup */
  remove("watch_file");
  create_file("watch_file");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  /* watching a dir is the only way to get fsevents involved on apple
     platforms */
  r = uv_fs_event_start(&fs_event,
                        fs_event_cb_file_current_dir,
                        file_or_dir == 1 ? "." : "watch_file",
                        0);
  ASSERT(r == 0);

  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);

  r = uv_timer_start(&timer, timer_cb_touch, 100, 0);
  ASSERT(r == 0);

  ASSERT(timer_cb_touch_called == 0);
  ASSERT(fs_event_cb_called == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(timer_cb_touch_called == 1);
  ASSERT(fs_event_cb_called == 1);

  /* Cleanup */
  remove("watch_file");
  fs_event_cb_called = 0;
  timer_cb_touch_called = 0;
  uv_run(loop, UV_RUN_DEFAULT); /* flush pending closes */
}